

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi,bool Mfactor,bool Kfactor,
          bool Rfactor,bool Gfactor)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer psVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  ChVectorDynamic<> *pCVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  double dVar19;
  long lVar20;
  ulong uVar21;
  double *pdVar22;
  undefined3 in_register_00000089;
  long lVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> FiMKR_local;
  ChMatrix33<double> AtolocwelA;
  ChQuaternion<double> q_1;
  ChMatrix33<double> Atoabs;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> AtolocwelB;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_208;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  ChElementBeamTaperedTimoshenko *local_1d8;
  ChVectorDynamic<> *local_1d0;
  ChMatrix33<double> local_1c8;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_178;
  double local_130 [3];
  ChMatrix33<double> local_118;
  double local_c8 [4];
  ChMatrix33<double> local_a8;
  ChMatrixRef local_58;
  
  local_1d0 = Fi;
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x44c,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
                 );
  }
  local_1d8 = (ChElementBeamTaperedTimoshenko *)
              CONCAT44(local_1d8._4_4_,CONCAT31(in_register_00000089,Gfactor));
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x44d,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
                 );
  }
  local_1e8.m_storage.m_data = (double *)0x0;
  local_1e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1e8,0xc);
  if (-1 < local_1e8.m_storage.m_rows) {
    if ((double)local_1e8.m_storage.m_rows != 0.0) {
      memset(local_1e8.m_storage.m_data,0,local_1e8.m_storage.m_rows << 3);
    }
    if (!Mfactor) {
LAB_006863a1:
      if (Kfactor) {
        local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0
        ;
        local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,0xc);
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [6])(this,&local_118);
        if ((double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols !=
            local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
        goto LAB_00686e14;
        local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0
        ;
        local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                   (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows,1);
        dVar19 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                         .m_storage.m_rows;
        if (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
            != dVar19) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                     (Index)dVar19,1);
        }
        if ((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] < 0) goto LAB_00686df5;
        if (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
            != 0.0) {
          memset((void *)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[0],0,
                 (long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] << 3);
        }
        local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0
        ;
        Eigen::internal::
        generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1c8,&this->Km,
                   (Matrix<double,__1,_1,_0,__1,_1> *)&local_118,(Scalar *)&local_a8);
        if ((double)local_1e8.m_storage.m_rows !=
            local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
        goto LAB_00686e71;
        dVar19 = (double)(local_1e8.m_storage.m_rows + 7);
        if (-1 < local_1e8.m_storage.m_rows) {
          dVar19 = (double)local_1e8.m_storage.m_rows;
        }
        dVar19 = (double)((ulong)dVar19 & 0xfffffffffffffff8);
        if (7 < local_1e8.m_storage.m_rows) {
          lVar20 = 0;
          do {
            auVar24 = vsubpd_avx512f(*(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar20),
                                     *(undefined1 (*) [64])
                                      ((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array[0] + lVar20 * 8));
            *(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar20) = auVar24;
            lVar20 = lVar20 + 8;
          } while (lVar20 < (long)dVar19);
        }
        if ((long)dVar19 < local_1e8.m_storage.m_rows) {
          do {
            local_1e8.m_storage.m_data[(long)dVar19] =
                 local_1e8.m_storage.m_data[(long)dVar19] -
                 *(double *)
                  ((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[0] + dVar19 * 8);
            dVar19 = (double)((long)dVar19 + 1);
          } while ((double)local_1e8.m_storage.m_rows != dVar19);
        }
        if ((double *)
            local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != (double *)0x0) {
          free(*(void **)((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] + -8));
        }
        if (local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != 0.0) {
          free(*(void **)((long)local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] - 8));
        }
      }
      if (!Rfactor) {
LAB_006866ab:
        ChMatrix33<double>::ChMatrix33(&local_118,&this->q_element_abs_rot);
        psVar9 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar10 = (psVar9->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var18 = (psVar9->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          }
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)&peVar10->field_0x38;
        dVar19 = *(double *)&peVar10->field_0x40;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar19;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(double *)&peVar10->field_0x48;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(double *)&peVar10->field_0x50;
        dVar1 = (this->q_element_abs_rot).m_data[0];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar1;
        dVar2 = (this->q_element_abs_rot).m_data[1];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar2;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar19 * dVar2;
        auVar39 = vfmadd231sd_fma(auVar44,auVar25,auVar39);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (this->q_element_abs_rot).m_data[2];
        auVar39 = vfmadd231sd_fma(auVar39,auVar31,auVar46);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = (this->q_element_abs_rot).m_data[3];
        auVar39 = vfmadd231sd_fma(auVar39,auVar34,auVar48);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = dVar1 * dVar19;
        auVar44 = vfmsub231sd_fma(auVar50,auVar25,auVar42);
        auVar44 = vfmadd231sd_fma(auVar44,auVar34,auVar46);
        auVar50 = vfnmadd231sd_fma(auVar44,auVar31,auVar48);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = dVar1 * *(double *)&peVar10->field_0x48;
        auVar44 = vfmsub231sd_fma(auVar52,auVar25,auVar46);
        auVar44 = vfnmadd231sd_fma(auVar44,auVar34,auVar42);
        auVar44 = vfmadd231sd_fma(auVar44,auVar28,auVar48);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar1 * *(double *)&peVar10->field_0x50;
        auVar25 = vfmsub231sd_fma(auVar35,auVar25,auVar48);
        auVar25 = vfmadd231sd_fma(auVar25,auVar31,auVar42);
        auVar25 = vfnmadd231sd_fma(auVar25,auVar28,auVar46);
        local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             auVar39._0_8_;
        local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             auVar50._0_8_;
        local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             auVar44._0_8_;
        local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             auVar25._0_8_;
        ChMatrix33<double>::ChMatrix33(&local_1c8,(ChQuaternion<double> *)&local_a8);
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        psVar9 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar10 = psVar9[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var18 = psVar9[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          }
        }
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)&peVar10->field_0x38;
        dVar19 = *(double *)&peVar10->field_0x40;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar19;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(double *)&peVar10->field_0x48;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(double *)&peVar10->field_0x50;
        dVar1 = (this->q_element_abs_rot).m_data[0];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar1;
        dVar2 = (this->q_element_abs_rot).m_data[1];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar2;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar19 * dVar2;
        auVar39 = vfmadd231sd_fma(auVar45,auVar26,auVar40);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = (this->q_element_abs_rot).m_data[2];
        auVar39 = vfmadd231sd_fma(auVar39,auVar32,auVar47);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = (this->q_element_abs_rot).m_data[3];
        auVar39 = vfmadd231sd_fma(auVar39,auVar36,auVar49);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar1 * dVar19;
        auVar44 = vfmsub231sd_fma(auVar51,auVar26,auVar43);
        auVar44 = vfmadd231sd_fma(auVar44,auVar36,auVar47);
        auVar50 = vfnmadd231sd_fma(auVar44,auVar32,auVar49);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = dVar1 * *(double *)&peVar10->field_0x48;
        auVar44 = vfmsub231sd_fma(auVar53,auVar26,auVar47);
        auVar44 = vfnmadd231sd_fma(auVar44,auVar36,auVar43);
        auVar44 = vfmadd231sd_fma(auVar44,auVar29,auVar49);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar1 * *(double *)&peVar10->field_0x50;
        auVar25 = vfmsub231sd_fma(auVar37,auVar26,auVar49);
        auVar25 = vfmadd231sd_fma(auVar25,auVar32,auVar43);
        auVar25 = vfnmadd231sd_fma(auVar25,auVar29,auVar47);
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = auVar39._0_8_;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = auVar50._0_8_;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = auVar44._0_8_;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = auVar25._0_8_;
        ChMatrix33<double>::ChMatrix33(&local_a8,(ChQuaternion<double> *)&local_178);
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        local_208.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
        local_208.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_118;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_208,(iterator)0x0,(ChMatrix33<double> **)&local_178);
        if (local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_178.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)&local_1c8;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_208,
                     (iterator)
                     local_208.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_178);
        }
        else {
          *local_208.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = &local_1c8;
          local_208.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_208.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pCVar13 = local_1d0;
        if (local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_178.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)&local_118;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_208,
                     (iterator)
                     local_208.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_178);
        }
        else {
          *local_208.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = &local_118;
          local_208.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_208.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_208.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_178.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)&local_a8;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_208,
                     (iterator)
                     local_208.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_178);
        }
        else {
          *local_208.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = &local_a8;
          local_208.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_208.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_rows = 0;
        local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_cols = 0;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_1e8.m_storage.m_data;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_1e8.m_storage.m_rows;
        local_178.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (local_1e8.m_storage.m_rows < 0 && local_1e8.m_storage.m_data != (double *)0x0) {
          pcVar15 = 
          "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
        }
        else {
          local_178.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 1;
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (pCVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value =
               (pCVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = 1;
          if (-1 < local_58.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_rows.m_value ||
              local_58.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data == (double *)0x0) {
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = 1;
            ChMatrixCorotation::ComputeCK(&local_178,&local_208,4,&local_58);
            if (local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data != (double *)0x0) {
              free((void *)local_178.m_object.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            if ((char)local_1d8 != '\0') {
              local_178.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value = 0;
              local_178.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data = (double *)0x0;
              local_178.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value = 0;
              local_c8[2] = 0.0;
              local_c8[0] = 0.0;
              local_c8[1] = 0.0;
              if ((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_c8[3] = (this->super_ChElementBeam).length * 0.5;
                lVar20 = 0x18;
                lVar23 = 0;
                uVar17 = 0;
                local_1d8 = this;
                do {
                  peVar11 = (local_1d8->tapered_section).
                            super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  if (uVar17 == 0) {
                    peVar12 = (peVar11->sectionA).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    p_Var18 = (peVar11->sectionA).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                      }
                    }
                    ChFrameMoving<double>::GetWvel_loc
                              ((ChFrameMoving<double> *)
                               &(((((local_1d8->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_ChNodeFEAbase).field_0x18);
                    (**(code **)(*(long *)&(peVar12->super_ChBeamSectionRayleighAdvancedGeneric).
                                           super_ChBeamSectionEulerAdvancedGeneric.
                                           super_ChBeamSectionEuler + 0x80))
                              (peVar12,&local_178,local_c8,local_130);
                  }
                  else {
                    peVar12 = (peVar11->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    p_Var18 = (peVar11->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                      }
                    }
                    ChFrameMoving<double>::GetWvel_loc
                              ((ChFrameMoving<double> *)
                               &(((local_1d8->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                    (**(code **)(*(long *)&(peVar12->super_ChBeamSectionRayleighAdvancedGeneric).
                                           super_ChBeamSectionEulerAdvancedGeneric.
                                           super_ChBeamSectionEuler + 0x80))
                              (peVar12,&local_178,local_c8,local_130);
                  }
                  if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
                  }
                  peVar10 = (local_1d8->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ =
                       local_178.
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       .
                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_data;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = *(ulong *)&peVar10->field_0x58;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ =
                       (double)local_178.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_rows.m_value * *(double *)&peVar10->field_0x60;
                  auVar39 = vfmadd231sd_fma(auVar33,auVar27,auVar3);
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ =
                       local_178.
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       .
                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_cols.m_value;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = *(ulong *)&peVar10->field_0x68;
                  auVar39 = vfmadd231sd_fma(auVar39,auVar38,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = *(ulong *)&peVar10->field_0x70;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ =
                       (double)local_178.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_rows.m_value * *(double *)&peVar10->field_0x78;
                  auVar44 = vfmadd231sd_fma(auVar41,auVar27,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = *(ulong *)&peVar10->field_0x80;
                  auVar44 = vfmadd231sd_fma(auVar44,auVar38,auVar6);
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = *(ulong *)&peVar10->field_0x88;
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ =
                       (double)local_178.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_rows.m_value * *(double *)&peVar10->field_0x90;
                  auVar25 = vfmadd231sd_fma(auVar30,auVar27,auVar7);
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = *(ulong *)&peVar10->field_0x98;
                  auVar25 = vfmadd231sd_fma(auVar25,auVar38,auVar8);
                  local_130[0] = auVar39._0_8_;
                  local_130[1] = (double)auVar44._0_8_;
                  local_130[2] = (double)auVar25._0_8_;
                  if ((local_1d0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows + -3 < (long)(uVar17 * 6)) {
LAB_00686dd6:
                    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                                 );
                  }
                  pdVar22 = (local_1d0->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  uVar16 = 3;
                  if ((((ulong)(pdVar22 + uVar17 * 6) & 7) == 0) &&
                     (uVar16 = (ulong)(-((uint)((ulong)(pdVar22 + uVar17 * 6) >> 3) & 0x1fffffff) &
                                      7), 2 < uVar16)) {
                    uVar16 = 3;
                  }
                  if (uVar16 != 0) {
                    uVar21 = 0;
                    do {
                      *(double *)((long)pdVar22 + uVar21 * 8 + lVar23) =
                           *(double *)((long)pdVar22 + uVar21 * 8 + lVar23) -
                           local_c8[3] * local_130[uVar21];
                      uVar21 = uVar21 + 1;
                    } while (uVar16 != uVar21);
                  }
                  if (uVar16 < 3) {
                    do {
                      *(double *)((long)pdVar22 + uVar16 * 8 + lVar23) =
                           *(double *)((long)pdVar22 + uVar16 * 8 + lVar23) -
                           local_c8[3] * local_130[uVar16];
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != 3);
                  }
                  if ((local_1d0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows + -3 < (long)(uVar17 * 6 + 3)) goto LAB_00686dd6;
                  pdVar22 = (local_1d0->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  uVar16 = 3;
                  if ((((ulong)(pdVar22 + uVar17 * 6 + 3) & 7) == 0) &&
                     (uVar16 = (ulong)(-((uint)((ulong)(pdVar22 + uVar17 * 6 + 3) >> 3) & 0x1fffffff
                                        ) & 7), 2 < uVar16)) {
                    uVar16 = 3;
                  }
                  if (uVar16 != 0) {
                    uVar21 = 0;
                    do {
                      *(double *)((long)pdVar22 + uVar21 * 8 + lVar20) =
                           *(double *)((long)pdVar22 + uVar21 * 8 + lVar20) -
                           local_c8[3] * local_c8[uVar21];
                      uVar21 = uVar21 + 1;
                    } while (uVar16 != uVar21);
                  }
                  if (uVar16 < 3) {
                    lVar14 = uVar16 + 3;
                    do {
                      *(double *)((long)pdVar22 + lVar14 * 8 + lVar23) =
                           *(double *)((long)pdVar22 + lVar14 * 8 + lVar23) -
                           local_c8[3] * local_c8[lVar14 + -3];
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 6);
                  }
                  uVar17 = uVar17 + 1;
                  lVar23 = lVar23 + 0x30;
                  lVar20 = lVar20 + 0x30;
                } while (uVar17 < (ulong)((long)(local_1d8->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_1d8->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
            }
            if (local_208.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_208.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_208.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_208.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_1e8.m_storage.m_data != (double *)0x0) {
              free((void *)local_1e8.m_storage.m_data[-1]);
            }
            return;
          }
          pcVar15 = 
          "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
        }
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar15);
      }
      local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8,0xc);
      GetField_dt(this,(ChVectorDynamic<> *)&local_a8);
      if ((double)(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols !=
          local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
LAB_00686e14:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      lVar20 = (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_rows;
      if (lVar20 < 0) {
LAB_00686ec4:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&local_1c8,lVar20,lVar20,1);
      dVar19 = (double)(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_rows;
      if ((local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
           dVar19) ||
         (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
          4.94065645841247e-324)) {
        if ((long)dVar19 < 0) goto LAB_00686ec4;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_1c8,(Index)dVar19,(Index)dVar19,1);
      }
      local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      if (-1 < (long)((ulong)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2] |
                     (ulong)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[1])) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_1c8,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    *)&local_118,(assign_op<double,_double> *)&local_178);
        local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0
        ;
        Eigen::internal::
        generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_1c8,&this->Rm,
                   (Matrix<double,__1,_1,_0,__1,_1> *)&local_a8,(Scalar *)&local_118);
        if (((double)local_1e8.m_storage.m_rows !=
             local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
           || (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2] != 4.94065645841247e-324)) {
          pcVar15 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
          ;
LAB_00686f12:
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar15);
        }
        if (0 < local_1e8.m_storage.m_rows) {
          dVar19 = 0.0;
          pdVar22 = (double *)
                    local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0];
          do {
            local_1e8.m_storage.m_data[(long)dVar19] =
                 local_1e8.m_storage.m_data[(long)dVar19] - *pdVar22;
            dVar19 = (double)((long)dVar19 + 1);
            pdVar22 = pdVar22 + 1;
          } while ((double)local_1e8.m_storage.m_rows != dVar19);
        }
        if ((double *)
            local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != (double *)0x0) {
          free(*(void **)((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] + -8));
        }
        if (local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != 0.0) {
          free(*(void **)((long)local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] + -8));
        }
        goto LAB_006866ab;
      }
      pcVar15 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00686e0a;
    }
    local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,0xc);
    GetField_dtdt(this,(ChVectorDynamic<> *)&local_118);
    if ((double)(this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_cols !=
        local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
    goto LAB_00686e14;
    local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
               (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows,1);
    dVar19 = (double)(this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    if (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
        dVar19) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                 (Index)dVar19,1);
    }
    if (-1 < (long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1]) {
      if (local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
          0.0) {
        memset((void *)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0],0,
               (long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] << 3);
      }
      local_a8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1c8,&this->M,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_118,(Scalar *)&local_a8);
      if ((double)local_1e8.m_storage.m_rows ==
          local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
        dVar19 = (double)(local_1e8.m_storage.m_rows + 7);
        if (-1 < local_1e8.m_storage.m_rows) {
          dVar19 = (double)local_1e8.m_storage.m_rows;
        }
        dVar19 = (double)((ulong)dVar19 & 0xfffffffffffffff8);
        if (7 < local_1e8.m_storage.m_rows) {
          lVar20 = 0;
          do {
            auVar24 = vsubpd_avx512f(*(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar20),
                                     *(undefined1 (*) [64])
                                      ((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array[0] + lVar20 * 8));
            *(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar20) = auVar24;
            lVar20 = lVar20 + 8;
          } while (lVar20 < (long)dVar19);
        }
        if ((long)dVar19 < local_1e8.m_storage.m_rows) {
          do {
            local_1e8.m_storage.m_data[(long)dVar19] =
                 local_1e8.m_storage.m_data[(long)dVar19] -
                 *(double *)
                  ((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[0] + dVar19 * 8);
            dVar19 = (double)((long)dVar19 + 1);
          } while ((double)local_1e8.m_storage.m_rows != dVar19);
        }
        if ((double *)
            local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != (double *)0x0) {
          free(*(void **)((long)local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] + -8));
        }
        if (local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != 0.0) {
          free(*(void **)((long)local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] - 8));
        }
        goto LAB_006863a1;
      }
LAB_00686e71:
      pcVar15 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
      ;
      goto LAB_00686f12;
    }
  }
LAB_00686df5:
  pcVar15 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00686e0a:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar15);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi,
                                                           bool Mfactor,
                                                           bool Kfactor,
                                                           bool Rfactor,
                                                           bool Gfactor) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    ChVectorDynamic<> FiMKR_local(12);
    FiMKR_local.setZero();

    if (Mfactor && true) {
        // set up vector of nodal accelerations (in local element system)
        ChVectorDynamic<> displ_dtdt(12);
        this->GetField_dtdt(displ_dtdt);

        ChVectorDynamic<> FiM_local = this->M * displ_dtdt;  // this->M is the local mass matrix of element
        FiMKR_local -= FiM_local;
    }

    if (Kfactor) {
        // set up vector of nodal displacements and small rotations (in local element system)
        ChVectorDynamic<> displ(12);
        this->GetStateBlock(displ);

        // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
        ChVectorDynamic<> FiK_local = this->Km * displ;
        FiMKR_local -= FiK_local;
    }
    if (Rfactor) {
        // set up vector of nodal velocities (in local element system)
        ChVectorDynamic<> displ_dt(12);
        this->GetField_dt(displ_dt);

        // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
        ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;
        FiMKR_local -= FiR_local;
    }

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(FiMKR_local, R, 4, Fi);

    // DO NOT USE THIS PIECE OF CODE.
    // if (Mfactor && false) {  // Is this correct? Or the code in lines 1029~1036
    //    // set up vector of nodal accelarations (in absolute element system)
    //    ChVectorDynamic<> displ_dtdt(12);
    //    displ_dtdt.segment(0, 3) = nodes[0]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_par().eigen();        //但是之后dynamics求解发散
    //    displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_loc().eigen();  //但是之后dynamics求解发散

    //    displ_dtdt.segment(6, 3) = nodes[1]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_par().eigen();
    //    displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_loc().eigen();
    //    // this->GetField_dtdt(displ_dtdt);

    //    ChMatrixDynamic<> Mabs(12, 12);
    //    Mabs.setZero();
    //    this->ComputeKRMmatricesGlobal(Mabs, false, false,
    //                                   true);  // Mabs is the mass matrix in absolute coordinate for this element

    //    ChVectorDynamic<> FiM_abs = Mabs * displ_dtdt;
    //    Fi -= FiM_abs;
    //}

    if (Gfactor) {
        // Add also inertial quadratic terms: gyroscopic and centrifugal

        // CASE OF LUMPED MASS - fast
        double node_multiplier = 0.5 * length;
        ChVector<> mFcent_i;
        ChVector<> mTgyro_i;
        for (int i = 0; i < nodes.size(); ++i) {
            // int stride = i * 6;
            if (i == 0) {
                this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            } else {  // i==1
                this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            }
            ChQuaternion<> q_i(nodes[i]->GetRot());
            Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
            Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
        }
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}